

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_malloc.h
# Opt level: O0

void __thiscall vector_malloc<unsigned_char_*,_16U>::grow(vector_malloc<unsigned_char_*,_16U> *this)

{
  uchar **ppuVar1;
  uchar **t;
  vector_malloc<unsigned_char_*,_16U> *this_local;
  
  if (this->_capacity == 0) {
    this->_capacity = 0x10;
    ppuVar1 = (uchar **)malloc(this->_capacity << 3);
    this->_data = ppuVar1;
  }
  else {
    this->_capacity = this->_capacity << 1;
    ppuVar1 = (uchar **)malloc(this->_capacity << 3);
    memcpy(ppuVar1,this->_data,this->_size << 3);
    free(this->_data);
    this->_data = ppuVar1;
  }
  return;
}

Assistant:

void grow()
	{
		if (_capacity == 0) {
			_capacity = InitialSize;
			_data = static_cast<T*>(malloc(_capacity*sizeof(T)));
		} else {
			_capacity <<= 1;
			T* t = static_cast<T*>(malloc(_capacity*sizeof(T)));
			(void) memcpy(t, _data, _size*sizeof(T));
			free(_data);
			_data = t;
		}
	}